

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

Option * __thiscall CLI::Option::check(Option *this,Validator *validator,string *validator_name)

{
  pointer pVVar1;
  pointer pcVar2;
  long *local_40 [2];
  long local_30 [2];
  
  validator->non_modifying_ = true;
  std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&this->validators_,validator);
  if (validator_name->_M_string_length != 0) {
    pVVar1 = (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar2 = (validator_name->_M_dataplus)._M_p;
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar2,pcVar2 + validator_name->_M_string_length);
    ::std::__cxx11::string::operator=((string *)&pVVar1[-1].name_,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return this;
}

Assistant:

Option *check(Validator validator, const std::string &validator_name = "") {
        validator.non_modifying();
        validators_.push_back(std::move(validator));
        if(!validator_name.empty())
            validators_.back().name(validator_name);
        return this;
    }